

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yang_print_unique(lyout *out,int level,lys_module *module,lys_unique *uniq)

{
  char *value;
  char *pcVar1;
  ulong uVar2;
  
  ly_print(out,"%*sunique \"",(ulong)(uint)(level * 2),"");
  uVar2 = 0;
  while (uVar2 < uniq->expr_size) {
    value = transform_json2schema(module,uniq->expr[uVar2]);
    uVar2 = uVar2 + 1;
    pcVar1 = "";
    if (uVar2 < uniq->expr_size) {
      pcVar1 = " ";
    }
    ly_print(out,"%s%s",value,pcVar1);
    lydict_remove(module->ctx,value);
  }
  ly_print(out,"\"");
  return;
}

Assistant:

static void
yang_print_unique(struct lyout *out, int level, const struct lys_module *module, const struct lys_unique *uniq)
{
    int i;
    const char *str;

    ly_print(out, "%*sunique \"", LEVEL, INDENT);
    for (i = 0; i < uniq->expr_size; i++) {
        str = transform_json2schema(module, uniq->expr[i]);
        ly_print(out, "%s%s", str, i + 1 < uniq->expr_size ? " " : "");
        lydict_remove(module->ctx, str);
    }
    ly_print(out, "\"");
}